

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h264d_init.c
# Opt level: O0

MPP_RET prepare_init_dpb_info(H264_SLICE_t *currSlice)

{
  h264_dpb_buf_t *phVar1;
  h264_dec_ctx_t *phVar2;
  H264_DecCtx_t *p_Dec;
  H264_DpbBuf_t *p_Dpb;
  RK_U32 j;
  RK_U32 i;
  H264_SLICE_t *currSlice_local;
  
  phVar1 = currSlice->p_Dpb;
  phVar2 = currSlice->p_Dec;
  for (p_Dpb._4_4_ = 0; p_Dpb._4_4_ < 0x10; p_Dpb._4_4_ = p_Dpb._4_4_ + 1) {
    reset_dpb_info(phVar2->dpb_info + p_Dpb._4_4_);
  }
  p_Dpb._4_4_ = 0;
  for (p_Dpb._0_4_ = 0; (uint)p_Dpb < phVar1->ref_frames_in_buffer; p_Dpb._0_4_ = (uint)p_Dpb + 1) {
    if (phVar1->fs_ref[(uint)p_Dpb]->is_used == 3) {
      phVar2->dpb_info[p_Dpb._4_4_].refpic = phVar1->fs_ref[(uint)p_Dpb]->frame;
      if (phVar1->fs_ref[(uint)p_Dpb]->frame->iCodingType == 1) {
        phVar2->dpb_info[p_Dpb._4_4_].TOP_POC = phVar1->fs_ref[(uint)p_Dpb]->top_field->poc;
        phVar2->dpb_info[p_Dpb._4_4_].BOT_POC = phVar1->fs_ref[(uint)p_Dpb]->bottom_field->poc;
      }
      else if (phVar1->fs_ref[(uint)p_Dpb]->frame->frame_poc ==
               phVar1->fs_ref[(uint)p_Dpb]->frame->poc) {
        phVar2->dpb_info[p_Dpb._4_4_].TOP_POC = phVar1->fs_ref[(uint)p_Dpb]->frame->top_poc;
        phVar2->dpb_info[p_Dpb._4_4_].BOT_POC = phVar1->fs_ref[(uint)p_Dpb]->frame->bottom_poc;
      }
      else {
        phVar2->dpb_info[p_Dpb._4_4_].TOP_POC =
             phVar1->fs_ref[(uint)p_Dpb]->frame->top_poc -
             phVar1->fs_ref[(uint)p_Dpb]->frame->frame_poc;
        phVar2->dpb_info[p_Dpb._4_4_].BOT_POC =
             phVar1->fs_ref[(uint)p_Dpb]->frame->bottom_poc -
             phVar1->fs_ref[(uint)p_Dpb]->frame->frame_poc;
      }
      phVar2->dpb_info[p_Dpb._4_4_].field_flag =
           (uint)(phVar1->fs_ref[(uint)p_Dpb]->frame->iCodingType == 1);
      phVar2->dpb_info[p_Dpb._4_4_].slot_index =
           phVar1->fs_ref[(uint)p_Dpb]->frame->mem_mark->slot_idx;
      phVar2->dpb_info[p_Dpb._4_4_].colmv_is_used =
           phVar1->fs_ref[(uint)p_Dpb]->frame->colmv_no_used_flag == '\0';
    }
    else if (phVar1->fs_ref[(uint)p_Dpb]->is_used != 0) {
      if ((phVar1->fs_ref[(uint)p_Dpb]->is_used & 1U) == 0) {
        phVar2->dpb_info[p_Dpb._4_4_].refpic = phVar1->fs_ref[(uint)p_Dpb]->bottom_field;
        phVar2->dpb_info[p_Dpb._4_4_].TOP_POC = 0;
        phVar2->dpb_info[p_Dpb._4_4_].BOT_POC = phVar1->fs_ref[(uint)p_Dpb]->bottom_field->poc;
        phVar2->dpb_info[p_Dpb._4_4_].field_flag = 1;
        phVar2->dpb_info[p_Dpb._4_4_].slot_index =
             phVar1->fs_ref[(uint)p_Dpb]->bottom_field->mem_mark->slot_idx;
        phVar2->dpb_info[p_Dpb._4_4_].colmv_is_used =
             phVar1->fs_ref[(uint)p_Dpb]->bottom_field->colmv_no_used_flag == '\0';
      }
      else {
        phVar2->dpb_info[p_Dpb._4_4_].refpic = phVar1->fs_ref[(uint)p_Dpb]->top_field;
        phVar2->dpb_info[p_Dpb._4_4_].TOP_POC = phVar1->fs_ref[(uint)p_Dpb]->top_field->poc;
        phVar2->dpb_info[p_Dpb._4_4_].BOT_POC = 0;
        phVar2->dpb_info[p_Dpb._4_4_].field_flag = 1;
        phVar2->dpb_info[p_Dpb._4_4_].slot_index =
             phVar1->fs_ref[(uint)p_Dpb]->top_field->mem_mark->slot_idx;
        phVar2->dpb_info[p_Dpb._4_4_].colmv_is_used =
             phVar1->fs_ref[(uint)p_Dpb]->top_field->colmv_no_used_flag == '\0';
      }
    }
    phVar2->dpb_info[p_Dpb._4_4_].frame_num = (RK_U16)phVar1->fs_ref[(uint)p_Dpb]->frame_num;
    phVar2->dpb_info[p_Dpb._4_4_].is_long_term = 0;
    phVar2->dpb_info[p_Dpb._4_4_].long_term_pic_num = 0;
    phVar2->dpb_info[p_Dpb._4_4_].long_term_frame_idx = 0;
    phVar2->dpb_info[p_Dpb._4_4_].voidx = phVar1->fs_ref[(uint)p_Dpb]->layer_id;
    phVar2->dpb_info[p_Dpb._4_4_].view_id = phVar1->fs_ref[(uint)p_Dpb]->view_id;
    phVar2->dpb_info[p_Dpb._4_4_].is_used = phVar1->fs_ref[(uint)p_Dpb]->is_used;
    p_Dpb._4_4_ = p_Dpb._4_4_ + 1;
  }
  for (p_Dpb._0_4_ = 0; (uint)p_Dpb < phVar1->ltref_frames_in_buffer; p_Dpb._0_4_ = (uint)p_Dpb + 1)
  {
    if (phVar1->fs_ltref[(uint)p_Dpb]->is_used == 3) {
      phVar2->dpb_info[p_Dpb._4_4_].refpic = phVar1->fs_ltref[(uint)p_Dpb]->frame;
      if (phVar1->fs_ltref[(uint)p_Dpb]->frame->iCodingType == 1) {
        phVar2->dpb_info[p_Dpb._4_4_].TOP_POC = phVar1->fs_ltref[(uint)p_Dpb]->top_field->poc;
        phVar2->dpb_info[p_Dpb._4_4_].BOT_POC = phVar1->fs_ltref[(uint)p_Dpb]->bottom_field->poc;
      }
      else if (phVar1->fs_ltref[(uint)p_Dpb]->frame->frame_poc ==
               phVar1->fs_ltref[(uint)p_Dpb]->frame->poc) {
        phVar2->dpb_info[p_Dpb._4_4_].TOP_POC = phVar1->fs_ltref[(uint)p_Dpb]->frame->top_poc;
        phVar2->dpb_info[p_Dpb._4_4_].BOT_POC = phVar1->fs_ltref[(uint)p_Dpb]->frame->bottom_poc;
      }
      else {
        phVar2->dpb_info[p_Dpb._4_4_].TOP_POC =
             phVar1->fs_ltref[(uint)p_Dpb]->frame->top_poc -
             phVar1->fs_ltref[(uint)p_Dpb]->frame->frame_poc;
        phVar2->dpb_info[p_Dpb._4_4_].BOT_POC =
             phVar1->fs_ltref[(uint)p_Dpb]->frame->bottom_poc -
             phVar1->fs_ltref[(uint)p_Dpb]->frame->frame_poc;
      }
      phVar2->dpb_info[p_Dpb._4_4_].field_flag =
           (uint)(phVar1->fs_ltref[(uint)p_Dpb]->frame->iCodingType == 1);
      phVar2->dpb_info[p_Dpb._4_4_].slot_index =
           phVar1->fs_ltref[(uint)p_Dpb]->frame->mem_mark->slot_idx;
      phVar2->dpb_info[p_Dpb._4_4_].colmv_is_used =
           phVar1->fs_ltref[(uint)p_Dpb]->frame->colmv_no_used_flag == '\0';
      phVar2->dpb_info[p_Dpb._4_4_].long_term_pic_num =
           phVar1->fs_ltref[(uint)p_Dpb]->frame->long_term_pic_num;
    }
    else if (phVar1->fs_ltref[(uint)p_Dpb]->is_used != 0) {
      if ((phVar1->fs_ltref[(uint)p_Dpb]->is_used & 1U) == 0) {
        phVar2->dpb_info[p_Dpb._4_4_].refpic = phVar1->fs_ltref[(uint)p_Dpb]->bottom_field;
        phVar2->dpb_info[p_Dpb._4_4_].TOP_POC = 0;
        phVar2->dpb_info[p_Dpb._4_4_].BOT_POC = phVar1->fs_ltref[(uint)p_Dpb]->bottom_field->poc;
        phVar2->dpb_info[p_Dpb._4_4_].field_flag = 1;
        phVar2->dpb_info[p_Dpb._4_4_].slot_index =
             phVar1->fs_ltref[(uint)p_Dpb]->bottom_field->mem_mark->slot_idx;
        phVar2->dpb_info[p_Dpb._4_4_].colmv_is_used =
             phVar1->fs_ltref[(uint)p_Dpb]->bottom_field->colmv_no_used_flag == '\0';
        phVar2->dpb_info[p_Dpb._4_4_].long_term_pic_num =
             phVar1->fs_ltref[(uint)p_Dpb]->bottom_field->long_term_pic_num;
      }
      else {
        phVar2->dpb_info[p_Dpb._4_4_].refpic = phVar1->fs_ltref[(uint)p_Dpb]->top_field;
        phVar2->dpb_info[p_Dpb._4_4_].TOP_POC = phVar1->fs_ltref[(uint)p_Dpb]->top_field->poc;
        phVar2->dpb_info[p_Dpb._4_4_].BOT_POC = 0;
        phVar2->dpb_info[p_Dpb._4_4_].field_flag = 1;
        phVar2->dpb_info[p_Dpb._4_4_].slot_index =
             phVar1->fs_ltref[(uint)p_Dpb]->top_field->mem_mark->slot_idx;
        phVar2->dpb_info[p_Dpb._4_4_].colmv_is_used =
             phVar1->fs_ltref[(uint)p_Dpb]->top_field->colmv_no_used_flag == '\0';
        phVar2->dpb_info[p_Dpb._4_4_].long_term_pic_num =
             phVar1->fs_ltref[(uint)p_Dpb]->top_field->long_term_pic_num;
      }
    }
    phVar2->dpb_info[p_Dpb._4_4_].frame_num =
         (RK_U16)phVar1->fs_ltref[(uint)p_Dpb]->long_term_frame_idx;
    phVar2->dpb_info[p_Dpb._4_4_].is_long_term = 1;
    phVar2->dpb_info[p_Dpb._4_4_].long_term_frame_idx =
         phVar1->fs_ltref[(uint)p_Dpb]->long_term_frame_idx;
    phVar2->dpb_info[p_Dpb._4_4_].voidx = phVar1->fs_ltref[(uint)p_Dpb]->layer_id;
    phVar2->dpb_info[p_Dpb._4_4_].view_id = phVar1->fs_ltref[(uint)p_Dpb]->view_id;
    phVar2->dpb_info[p_Dpb._4_4_].is_used = phVar1->fs_ltref[(uint)p_Dpb]->is_used;
    p_Dpb._4_4_ = p_Dpb._4_4_ + 1;
  }
  p_Dpb._0_4_ = 0;
  do {
    if (phVar1->used_size_il <= (uint)p_Dpb) {
      return MPP_OK;
    }
    if ((currSlice->structure == 3) && (phVar1->fs_ilref[(uint)p_Dpb]->is_used == 3)) {
      if ((phVar1->fs_ilref[(uint)p_Dpb]->inter_view_flag[0] == 0) &&
         (phVar1->fs_ilref[(uint)p_Dpb]->inter_view_flag[1] == 0)) {
        return MPP_OK;
      }
      phVar2->dpb_info[p_Dpb._4_4_].refpic = phVar1->fs_ilref[(uint)p_Dpb]->frame;
      if (phVar1->fs_ilref[(uint)p_Dpb]->frame->is_mmco_5 == '\0') {
        phVar2->dpb_info[p_Dpb._4_4_].TOP_POC = phVar1->fs_ilref[(uint)p_Dpb]->frame->top_poc;
        phVar2->dpb_info[p_Dpb._4_4_].BOT_POC = phVar1->fs_ilref[(uint)p_Dpb]->frame->bottom_poc;
      }
      else {
        phVar2->dpb_info[p_Dpb._4_4_].TOP_POC = phVar1->fs_ilref[(uint)p_Dpb]->frame->top_poc_mmco5;
        phVar2->dpb_info[p_Dpb._4_4_].BOT_POC = phVar1->fs_ilref[(uint)p_Dpb]->frame->bot_poc_mmco5;
      }
      phVar2->dpb_info[p_Dpb._4_4_].field_flag =
           (uint)(phVar1->fs_ilref[(uint)p_Dpb]->frame->iCodingType == 1);
      phVar2->dpb_info[p_Dpb._4_4_].slot_index =
           phVar1->fs_ilref[(uint)p_Dpb]->frame->mem_mark->slot_idx;
      phVar2->dpb_info[p_Dpb._4_4_].colmv_is_used =
           phVar1->fs_ilref[(uint)p_Dpb]->frame->colmv_no_used_flag == '\0';
    }
    else if ((currSlice->structure != 3) && (phVar1->fs_ilref[(uint)p_Dpb]->is_used != 0)) {
      if (phVar1->fs_ilref[(uint)p_Dpb]->is_used == 3) {
        if (phVar1->fs_ilref[(uint)p_Dpb]->inter_view_flag[(int)(uint)(currSlice->structure == 2)]
            == 0) {
          return MPP_OK;
        }
        phVar2->dpb_info[p_Dpb._4_4_].refpic = phVar1->fs_ilref[(uint)p_Dpb]->top_field;
        if (phVar1->fs_ilref[(uint)p_Dpb]->top_field->is_mmco_5 == '\0') {
          phVar2->dpb_info[p_Dpb._4_4_].TOP_POC = phVar1->fs_ilref[(uint)p_Dpb]->top_field->top_poc;
        }
        else {
          phVar2->dpb_info[p_Dpb._4_4_].TOP_POC =
               phVar1->fs_ilref[(uint)p_Dpb]->top_field->top_poc_mmco5;
        }
        if (phVar1->fs_ilref[(uint)p_Dpb]->bottom_field->is_mmco_5 == '\0') {
          phVar2->dpb_info[p_Dpb._4_4_].BOT_POC =
               phVar1->fs_ilref[(uint)p_Dpb]->bottom_field->bottom_poc;
        }
        else {
          phVar2->dpb_info[p_Dpb._4_4_].BOT_POC =
               phVar1->fs_ilref[(uint)p_Dpb]->bottom_field->bot_poc_mmco5;
        }
        phVar2->dpb_info[p_Dpb._4_4_].field_flag =
             (uint)(phVar1->fs_ilref[(uint)p_Dpb]->frame->iCodingType == 1);
        phVar2->dpb_info[p_Dpb._4_4_].slot_index =
             phVar1->fs_ilref[(uint)p_Dpb]->frame->mem_mark->slot_idx;
        phVar2->dpb_info[p_Dpb._4_4_].colmv_is_used =
             phVar1->fs_ilref[(uint)p_Dpb]->frame->colmv_no_used_flag == '\0';
      }
      if ((phVar1->fs_ilref[(uint)p_Dpb]->is_used & 1U) == 0) {
        if (phVar1->fs_ilref[(uint)p_Dpb]->inter_view_flag[1] == 0) {
          return MPP_OK;
        }
        phVar2->dpb_info[p_Dpb._4_4_].refpic = phVar1->fs_ilref[(uint)p_Dpb]->bottom_field;
        phVar2->dpb_info[p_Dpb._4_4_].TOP_POC = 0;
        if (phVar1->fs_ilref[(uint)p_Dpb]->bottom_field->is_mmco_5 == '\0') {
          phVar2->dpb_info[p_Dpb._4_4_].BOT_POC =
               phVar1->fs_ilref[(uint)p_Dpb]->bottom_field->bottom_poc;
        }
        else {
          phVar2->dpb_info[p_Dpb._4_4_].BOT_POC =
               phVar1->fs_ilref[(uint)p_Dpb]->bottom_field->bot_poc_mmco5;
        }
        phVar2->dpb_info[p_Dpb._4_4_].field_flag = 1;
        phVar2->dpb_info[p_Dpb._4_4_].slot_index =
             phVar1->fs_ilref[(uint)p_Dpb]->bottom_field->mem_mark->slot_idx;
        phVar2->dpb_info[p_Dpb._4_4_].colmv_is_used =
             phVar1->fs_ilref[(uint)p_Dpb]->bottom_field->colmv_no_used_flag == '\0';
      }
      else {
        if (phVar1->fs_ilref[(uint)p_Dpb]->inter_view_flag[0] == 0) {
          return MPP_OK;
        }
        phVar2->dpb_info[p_Dpb._4_4_].refpic = phVar1->fs_ilref[(uint)p_Dpb]->top_field;
        if (phVar1->fs_ilref[(uint)p_Dpb]->top_field->is_mmco_5 == '\0') {
          phVar2->dpb_info[p_Dpb._4_4_].TOP_POC = phVar1->fs_ilref[(uint)p_Dpb]->top_field->top_poc;
        }
        else {
          phVar2->dpb_info[p_Dpb._4_4_].TOP_POC =
               phVar1->fs_ilref[(uint)p_Dpb]->top_field->top_poc_mmco5;
        }
        phVar2->dpb_info[p_Dpb._4_4_].BOT_POC = 0;
        phVar2->dpb_info[p_Dpb._4_4_].field_flag = 1;
        phVar2->dpb_info[p_Dpb._4_4_].slot_index =
             phVar1->fs_ilref[(uint)p_Dpb]->top_field->mem_mark->slot_idx;
        phVar2->dpb_info[p_Dpb._4_4_].colmv_is_used =
             phVar1->fs_ilref[(uint)p_Dpb]->top_field->colmv_no_used_flag == '\0';
      }
    }
    phVar2->dpb_info[p_Dpb._4_4_].frame_num = (RK_U16)phVar1->fs_ilref[(uint)p_Dpb]->frame_num;
    phVar2->dpb_info[p_Dpb._4_4_].is_long_term = 0;
    phVar2->dpb_info[p_Dpb._4_4_].is_ilt_flag = 1;
    phVar2->dpb_info[p_Dpb._4_4_].long_term_pic_num = 0;
    phVar2->dpb_info[p_Dpb._4_4_].long_term_frame_idx = 0;
    phVar2->dpb_info[p_Dpb._4_4_].voidx = phVar1->fs_ilref[(uint)p_Dpb]->layer_id;
    phVar2->dpb_info[p_Dpb._4_4_].view_id = phVar1->fs_ilref[(uint)p_Dpb]->view_id;
    phVar2->dpb_info[p_Dpb._4_4_].is_used = phVar1->fs_ilref[(uint)p_Dpb]->is_used;
    p_Dpb._4_4_ = p_Dpb._4_4_ + 1;
    p_Dpb._0_4_ = (uint)p_Dpb + 1;
  } while( true );
}

Assistant:

static MPP_RET prepare_init_dpb_info(H264_SLICE_t *currSlice)
{
    RK_U32 i = 0, j = 0;
    H264_DpbBuf_t *p_Dpb = currSlice->p_Dpb;
    H264_DecCtx_t *p_Dec = currSlice->p_Dec;

    //!< reset parameters
    for (i = 0; i < MAX_DPB_SIZE; i++) {
        reset_dpb_info(&p_Dec->dpb_info[i]);
    }
    //!< reference
#if 1
    for (i = 0, j = 0; j < p_Dpb->ref_frames_in_buffer; i++, j++) {
        if (p_Dpb->fs_ref[j]->is_used == 3) {
            p_Dec->dpb_info[i].refpic = p_Dpb->fs_ref[j]->frame;
            if (p_Dpb->fs_ref[j]->frame->iCodingType == FIELD_CODING) {
                p_Dec->dpb_info[i].TOP_POC = p_Dpb->fs_ref[j]->top_field->poc;
                p_Dec->dpb_info[i].BOT_POC = p_Dpb->fs_ref[j]->bottom_field->poc;
            } else {
                if (p_Dpb->fs_ref[j]->frame->frame_poc != p_Dpb->fs_ref[j]->frame->poc) {
                    p_Dec->dpb_info[i].TOP_POC = p_Dpb->fs_ref[j]->frame->top_poc - p_Dpb->fs_ref[j]->frame->frame_poc;
                    p_Dec->dpb_info[i].BOT_POC = p_Dpb->fs_ref[j]->frame->bottom_poc - p_Dpb->fs_ref[j]->frame->frame_poc;
                } else {
                    p_Dec->dpb_info[i].TOP_POC = p_Dpb->fs_ref[j]->frame->top_poc;
                    p_Dec->dpb_info[i].BOT_POC = p_Dpb->fs_ref[j]->frame->bottom_poc;
                }
            }
            p_Dec->dpb_info[i].field_flag = p_Dpb->fs_ref[j]->frame->iCodingType == FIELD_CODING;
            p_Dec->dpb_info[i].slot_index = p_Dpb->fs_ref[j]->frame->mem_mark->slot_idx;
            p_Dec->dpb_info[i].colmv_is_used = (p_Dpb->fs_ref[j]->frame->colmv_no_used_flag ? 0 : 1);
        } else if (p_Dpb->fs_ref[j]->is_used) {
            if (p_Dpb->fs_ref[j]->is_used & 0x1) { // top
                p_Dec->dpb_info[i].refpic = p_Dpb->fs_ref[j]->top_field;

                p_Dec->dpb_info[i].TOP_POC = p_Dpb->fs_ref[j]->top_field->poc;
                p_Dec->dpb_info[i].BOT_POC = 0;
                p_Dec->dpb_info[i].field_flag = 1;
                p_Dec->dpb_info[i].slot_index = p_Dpb->fs_ref[j]->top_field->mem_mark->slot_idx;
                p_Dec->dpb_info[i].colmv_is_used = (p_Dpb->fs_ref[j]->top_field->colmv_no_used_flag ? 0 : 1);
            } else { // if(p_Dpb->fs_ref[j]->is_used & 0x2) // bottom
                p_Dec->dpb_info[i].refpic = p_Dpb->fs_ref[j]->bottom_field;
                p_Dec->dpb_info[i].TOP_POC = 0;
                p_Dec->dpb_info[i].BOT_POC = p_Dpb->fs_ref[j]->bottom_field->poc;
                p_Dec->dpb_info[i].field_flag = 1;
                p_Dec->dpb_info[i].slot_index = p_Dpb->fs_ref[j]->bottom_field->mem_mark->slot_idx;
                p_Dec->dpb_info[i].colmv_is_used = (p_Dpb->fs_ref[j]->bottom_field->colmv_no_used_flag ? 0 : 1);
            }
        }
        p_Dec->dpb_info[i].frame_num = p_Dpb->fs_ref[j]->frame_num;
        p_Dec->dpb_info[i].is_long_term = 0;
        p_Dec->dpb_info[i].long_term_pic_num = 0;
        p_Dec->dpb_info[i].long_term_frame_idx = 0;
        p_Dec->dpb_info[i].voidx = p_Dpb->fs_ref[j]->layer_id;
        p_Dec->dpb_info[i].view_id = p_Dpb->fs_ref[j]->view_id;
        p_Dec->dpb_info[i].is_used = p_Dpb->fs_ref[j]->is_used;
    }
#endif
    //!<---- long term reference
#if 1
    for (j = 0; j < p_Dpb->ltref_frames_in_buffer; i++, j++) {
        if (p_Dpb->fs_ltref[j]->is_used == 3) {
            p_Dec->dpb_info[i].refpic = p_Dpb->fs_ltref[j]->frame;

            if (p_Dpb->fs_ltref[j]->frame->iCodingType == FIELD_CODING) {
                p_Dec->dpb_info[i].TOP_POC = p_Dpb->fs_ltref[j]->top_field->poc;
                p_Dec->dpb_info[i].BOT_POC = p_Dpb->fs_ltref[j]->bottom_field->poc;
            } else {
                if (p_Dpb->fs_ltref[j]->frame->frame_poc != p_Dpb->fs_ltref[j]->frame->poc) {
                    p_Dec->dpb_info[i].TOP_POC = p_Dpb->fs_ltref[j]->frame->top_poc - p_Dpb->fs_ltref[j]->frame->frame_poc;
                    p_Dec->dpb_info[i].BOT_POC = p_Dpb->fs_ltref[j]->frame->bottom_poc - p_Dpb->fs_ltref[j]->frame->frame_poc;
                } else {
                    p_Dec->dpb_info[i].TOP_POC = p_Dpb->fs_ltref[j]->frame->top_poc;
                    p_Dec->dpb_info[i].BOT_POC = p_Dpb->fs_ltref[j]->frame->bottom_poc;
                }

            }
            p_Dec->dpb_info[i].field_flag = p_Dpb->fs_ltref[j]->frame->iCodingType == FIELD_CODING;
            p_Dec->dpb_info[i].slot_index = p_Dpb->fs_ltref[j]->frame->mem_mark->slot_idx;
            p_Dec->dpb_info[i].colmv_is_used = (p_Dpb->fs_ltref[j]->frame->colmv_no_used_flag ? 0 : 1);
            p_Dec->dpb_info[i].long_term_pic_num = p_Dpb->fs_ltref[j]->frame->long_term_pic_num;
        } else if (p_Dpb->fs_ltref[j]->is_used) {
            if (p_Dpb->fs_ltref[j]->is_used & 0x1) {
                p_Dec->dpb_info[i].refpic = p_Dpb->fs_ltref[j]->top_field;
                p_Dec->dpb_info[i].TOP_POC = p_Dpb->fs_ltref[j]->top_field->poc;
                p_Dec->dpb_info[i].BOT_POC = 0;
                p_Dec->dpb_info[i].field_flag = 1;
                p_Dec->dpb_info[i].slot_index = p_Dpb->fs_ltref[j]->top_field->mem_mark->slot_idx;
                p_Dec->dpb_info[i].colmv_is_used = (p_Dpb->fs_ltref[j]->top_field->colmv_no_used_flag ? 0 : 1);
                p_Dec->dpb_info[i].long_term_pic_num = p_Dpb->fs_ltref[j]->top_field->long_term_pic_num;
            } else { // if(p_Dpb->fs_ref[j]->is_used & 0x2)
                p_Dec->dpb_info[i].refpic = p_Dpb->fs_ltref[j]->bottom_field;
                p_Dec->dpb_info[i].TOP_POC = 0;
                p_Dec->dpb_info[i].BOT_POC = p_Dpb->fs_ltref[j]->bottom_field->poc;
                p_Dec->dpb_info[i].field_flag = 1;
                p_Dec->dpb_info[i].slot_index = p_Dpb->fs_ltref[j]->bottom_field->mem_mark->slot_idx;
                p_Dec->dpb_info[i].colmv_is_used = (p_Dpb->fs_ltref[j]->bottom_field->colmv_no_used_flag ? 0 : 1);
                p_Dec->dpb_info[i].long_term_pic_num = p_Dpb->fs_ltref[j]->bottom_field->long_term_pic_num;
            }
        }
        p_Dec->dpb_info[i].frame_num = p_Dpb->fs_ltref[j]->long_term_frame_idx; //long term use long_term_frame_idx
        p_Dec->dpb_info[i].is_long_term = 1;
        p_Dec->dpb_info[i].long_term_frame_idx = p_Dpb->fs_ltref[j]->long_term_frame_idx;
        p_Dec->dpb_info[i].voidx = p_Dpb->fs_ltref[j]->layer_id;
        p_Dec->dpb_info[i].view_id = p_Dpb->fs_ltref[j]->view_id;
        p_Dec->dpb_info[i].is_used = p_Dpb->fs_ltref[j]->is_used;
    }
#endif
    //!< inter-layer reference (for multi-layered codecs)
#if 1
    for (j = 0; j < p_Dpb->used_size_il; i++, j++) {
        if (currSlice->structure == FRAME && p_Dpb->fs_ilref[j]->is_used == 3) {
            if (p_Dpb->fs_ilref[j]->inter_view_flag[0] == 0 && p_Dpb->fs_ilref[j]->inter_view_flag[1] == 0)
                break;
            p_Dec->dpb_info[i].refpic = p_Dpb->fs_ilref[j]->frame;

            if (p_Dpb->fs_ilref[j]->frame->is_mmco_5) {
                p_Dec->dpb_info[i].TOP_POC = p_Dpb->fs_ilref[j]->frame->top_poc_mmco5;
                p_Dec->dpb_info[i].BOT_POC = p_Dpb->fs_ilref[j]->frame->bot_poc_mmco5;
            } else {
                p_Dec->dpb_info[i].TOP_POC = p_Dpb->fs_ilref[j]->frame->top_poc;
                p_Dec->dpb_info[i].BOT_POC = p_Dpb->fs_ilref[j]->frame->bottom_poc;
            }
            p_Dec->dpb_info[i].field_flag = p_Dpb->fs_ilref[j]->frame->iCodingType == FIELD_CODING;
            p_Dec->dpb_info[i].slot_index = p_Dpb->fs_ilref[j]->frame->mem_mark->slot_idx;
            p_Dec->dpb_info[i].colmv_is_used = (p_Dpb->fs_ilref[j]->frame->colmv_no_used_flag ? 0 : 1);
        } else if (currSlice->structure != FRAME && p_Dpb->fs_ilref[j]->is_used) {
            if (p_Dpb->fs_ilref[j]->is_used == 0x3) {
                if (p_Dpb->fs_ilref[j]->inter_view_flag[currSlice->structure == BOTTOM_FIELD] == 0)
                    break;
                p_Dec->dpb_info[i].refpic = p_Dpb->fs_ilref[j]->top_field;

                if (p_Dpb->fs_ilref[j]->top_field->is_mmco_5) {
                    p_Dec->dpb_info[i].TOP_POC = p_Dpb->fs_ilref[j]->top_field->top_poc_mmco5;
                } else {
                    p_Dec->dpb_info[i].TOP_POC = p_Dpb->fs_ilref[j]->top_field->top_poc;
                }
                if (p_Dpb->fs_ilref[j]->bottom_field->is_mmco_5) {
                    p_Dec->dpb_info[i].BOT_POC = p_Dpb->fs_ilref[j]->bottom_field->bot_poc_mmco5;
                } else {
                    p_Dec->dpb_info[i].BOT_POC = p_Dpb->fs_ilref[j]->bottom_field->bottom_poc;
                }
                p_Dec->dpb_info[i].field_flag = p_Dpb->fs_ilref[j]->frame->iCodingType == FIELD_CODING;
                p_Dec->dpb_info[i].slot_index = p_Dpb->fs_ilref[j]->frame->mem_mark->slot_idx;
                p_Dec->dpb_info[i].colmv_is_used = (p_Dpb->fs_ilref[j]->frame->colmv_no_used_flag ? 0 : 1);
            }
            if (p_Dpb->fs_ilref[j]->is_used & 0x1) {
                if (p_Dpb->fs_ilref[j]->inter_view_flag[0] == 0)
                    break;
                p_Dec->dpb_info[i].refpic = p_Dpb->fs_ilref[j]->top_field;

                if (p_Dpb->fs_ilref[j]->top_field->is_mmco_5) {
                    p_Dec->dpb_info[i].TOP_POC = p_Dpb->fs_ilref[j]->top_field->top_poc_mmco5;
                } else {
                    p_Dec->dpb_info[i].TOP_POC = p_Dpb->fs_ilref[j]->top_field->top_poc;
                }
                p_Dec->dpb_info[i].BOT_POC = 0;
                p_Dec->dpb_info[i].field_flag = 1;
                p_Dec->dpb_info[i].slot_index = p_Dpb->fs_ilref[j]->top_field->mem_mark->slot_idx;
                p_Dec->dpb_info[i].colmv_is_used = (p_Dpb->fs_ilref[j]->top_field->colmv_no_used_flag ? 0 : 1);
            } else { // if(p_Dpb->fs_ref[j]->is_used & 0x2)
                if (p_Dpb->fs_ilref[j]->inter_view_flag[1] == 0)
                    break;
                p_Dec->dpb_info[i].refpic = p_Dpb->fs_ilref[j]->bottom_field;

                p_Dec->dpb_info[i].TOP_POC = 0;
                if (p_Dpb->fs_ilref[j]->bottom_field->is_mmco_5) {
                    p_Dec->dpb_info[i].BOT_POC = p_Dpb->fs_ilref[j]->bottom_field->bot_poc_mmco5;
                } else {
                    p_Dec->dpb_info[i].BOT_POC = p_Dpb->fs_ilref[j]->bottom_field->bottom_poc;
                }
                p_Dec->dpb_info[i].field_flag = 1;
                p_Dec->dpb_info[i].slot_index = p_Dpb->fs_ilref[j]->bottom_field->mem_mark->slot_idx;
                p_Dec->dpb_info[i].colmv_is_used = (p_Dpb->fs_ilref[j]->bottom_field->colmv_no_used_flag ? 0 : 1);
            }
        }
        p_Dec->dpb_info[i].frame_num = p_Dpb->fs_ilref[j]->frame_num;
        p_Dec->dpb_info[i].is_long_term = 0;//p_Dpb->fs_ilref[j]->is_long_term;
        p_Dec->dpb_info[i].is_ilt_flag = 1;
        p_Dec->dpb_info[i].long_term_pic_num = 0;
        p_Dec->dpb_info[i].long_term_frame_idx = 0;
        p_Dec->dpb_info[i].voidx = p_Dpb->fs_ilref[j]->layer_id;
        p_Dec->dpb_info[i].view_id = p_Dpb->fs_ilref[j]->view_id;
        p_Dec->dpb_info[i].is_used = p_Dpb->fs_ilref[j]->is_used;
    }
#endif

    return MPP_OK;
}